

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O3

ssize_t __thiscall bsplib::Unbuf::send(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pointer *ppEVar1;
  int iVar2;
  iterator __position;
  ulong uVar3;
  exception *this_00;
  ulong uVar4;
  Entry entry;
  undefined1 local_1b0 [16];
  size_t local_1a0;
  uint uStack_198;
  undefined4 uStack_194;
  
  __position._M_current =
       (this->m_sends).
       super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar4 = (long)__position._M_current -
          (long)(this->m_sends).
                super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start >> 5;
  uVar3 = 0x3fffffff - (long)this->m_pid;
  iVar2 = this->m_nprocs;
  if (uVar4 <= uVar3 / (ulong)(long)iVar2) {
    uStack_198 = ((int)uVar4 * iVar2 + this->m_pid) * 2;
    if (__position._M_current ==
        (this->m_sends).
        super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_1b0._0_4_ = __fd;
      local_1b0._8_8_ = __buf;
      local_1a0 = __n;
      std::vector<bsplib::Unbuf::Entry,std::allocator<bsplib::Unbuf::Entry>>::
      _M_realloc_insert<bsplib::Unbuf::Entry_const&>
                ((vector<bsplib::Unbuf::Entry,std::allocator<bsplib::Unbuf::Entry>> *)&this->m_sends
                 ,__position,(Entry *)local_1b0);
    }
    else {
      (__position._M_current)->size = __n;
      *(ulong *)&(__position._M_current)->tag = CONCAT44(uStack_194,uStack_198);
      *(ulong *)__position._M_current = CONCAT44(local_1b0._4_4_,__fd);
      (__position._M_current)->addr = (char *)__buf;
      ppEVar1 = &(this->m_sends).
                 super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
    return (ulong)uStack_198;
  }
  this_00 = (exception *)
            __cxa_allocate_exception(0x1a0,__position._M_current,uVar3 % (ulong)(long)iVar2);
  exception::exception((exception *)local_1b0,"bsp_hpput");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),"Too many HP messages",0x14);
  exception::exception(this_00,(exception *)local_1b0);
  __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
}

Assistant:

int Unbuf :: send( int dst_pid, const void * addr, size_t size )
{
    size_t int_max = std::numeric_limits<int>::max();
    if ( m_sends.size() > (int_max/2 - m_pid)/m_nprocs )
        throw exception("bsp_hpput") << "Too many HP messages";

    Entry entry = { dst_pid, 
                    static_cast<char *>(const_cast<void*>(addr)),
                    size,
                    (int( m_sends.size() ) * m_nprocs + m_pid)*2
                  };
    m_sends.push_back( entry );
    return entry.tag;
}